

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool __thiscall
cfgfile::details::parser_conffile_impl_t<cfgfile::string_trait_t>::start_first_tag_parsing
          (parser_conffile_impl_t<cfgfile::string_trait_t> *this)

{
  bool bVar1;
  lexeme_type_t lVar2;
  undefined8 uVar3;
  input_stream_t<cfgfile::string_trait_t> *piVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  exception_t<cfgfile::string_trait_t> *this_00;
  long in_RDI;
  lexeme_t<cfgfile::string_trait_t> lexeme;
  lexeme_t<cfgfile::string_trait_t> *in_stack_fffffffffffff7f8;
  string *str;
  lexeme_t<cfgfile::string_trait_t> *in_stack_fffffffffffff800;
  string_t *in_stack_fffffffffffff808;
  string_t *what;
  exception_t<cfgfile::string_trait_t> *in_stack_fffffffffffff810;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff830;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff838;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff840;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string local_6f1 [3];
  string_t local_689 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f9 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b1 [11];
  undefined1 local_442;
  tag_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd58;
  lexeme_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd60;
  parser_conffile_impl_t<cfgfile::string_trait_t> *in_stack_fffffffffffffd68;
  lexical_analyzer_t<cfgfile::string_trait_t> *in_stack_ffffffffffffffa8;
  lexeme_t<cfgfile::string_trait_t> local_38;
  byte local_1;
  
  lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(in_stack_ffffffffffffffa8);
  bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory
                    (*(tag_t<cfgfile::string_trait_t> **)(in_RDI + 8));
  if ((bVar1) && (lVar2 = lexeme_t<cfgfile::string_trait_t>::type(&local_38), lVar2 == null)) {
    uVar3 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)in_stack_fffffffffffff830);
    string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
    tag_t<cfgfile::string_trait_t>::name_abi_cxx11_
              (*(tag_t<cfgfile::string_trait_t> **)(in_RDI + 8));
    std::operator+(in_stack_fffffffffffff808,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)in_stack_fffffffffffff830);
    string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
    std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                       ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
    input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
    std::operator+(in_stack_fffffffffffff808,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffff800);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)in_stack_fffffffffffff830);
    string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
    std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    lexical_analyzer_t<cfgfile::string_trait_t>::line_number
              ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
    string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff7f8);
    std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
               (allocator<char> *)in_stack_fffffffffffff830);
    string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
    std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
    exception_t<cfgfile::string_trait_t>::exception_t
              (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                exception_t<cfgfile::string_trait_t>::~exception_t);
  }
  bVar1 = tag_t<cfgfile::string_trait_t>::is_mandatory
                    (*(tag_t<cfgfile::string_trait_t> **)(in_RDI + 8));
  if ((bVar1) || (lVar2 = lexeme_t<cfgfile::string_trait_t>::type(&local_38), lVar2 != null)) {
    lVar2 = lexeme_t<cfgfile::string_trait_t>::type(&local_38);
    if (lVar2 != start) {
      local_442 = 1;
      uVar3 = __cxa_allocate_exception(0x30);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)in_stack_fffffffffffff830);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      lexeme_t<cfgfile::string_trait_t>::value_abi_cxx11_(&local_38);
      std::operator+(in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)in_stack_fffffffffffff830);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                         ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
      input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
      std::operator+(in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)in_stack_fffffffffffff830);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
      string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff7f8);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff840,(char *)in_stack_fffffffffffff838,
                 (allocator<char> *)in_stack_fffffffffffff830);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      std::operator+(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
      exception_t<cfgfile::string_trait_t>::exception_t
                (in_stack_fffffffffffff810,in_stack_fffffffffffff808);
      local_442 = 0;
      __cxa_throw(uVar3,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    lexical_analyzer_t<cfgfile::string_trait_t>::next_lexeme(in_stack_ffffffffffffffa8);
    lexeme_t<cfgfile::string_trait_t>::operator=
              (in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
    lexeme_t<cfgfile::string_trait_t>::~lexeme_t((lexeme_t<cfgfile::string_trait_t> *)0x147c95);
    bVar1 = start_tag_parsing(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60,
                              in_stack_fffffffffffffd58);
    if (!bVar1) {
      __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              __cxa_allocate_exception(0x30);
      this_01 = local_5b1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__lhs,(allocator<char> *)in_stack_fffffffffffff830);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      tag_t<cfgfile::string_trait_t>::name_abi_cxx11_
                (*(tag_t<cfgfile::string_trait_t> **)(in_RDI + 8));
      std::operator+(in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      __rhs = local_5f9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__lhs,(allocator<char> *)__rhs);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      std::operator+(__lhs,__rhs);
      lexeme_t<cfgfile::string_trait_t>::value_abi_cxx11_(&local_38);
      std::operator+(in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__lhs,(allocator<char> *)__rhs);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      std::operator+(__lhs,__rhs);
      piVar4 = lexical_analyzer_t<cfgfile::string_trait_t>::input_stream
                         ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
      this_00 = (exception_t<cfgfile::string_trait_t> *)
                input_stream_t<cfgfile::string_trait_t>::file_name_abi_cxx11_(piVar4);
      std::operator+(in_stack_fffffffffffff808,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff800);
      what = local_689;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__lhs,(allocator<char> *)__rhs);
      string_trait_t::from_ascii((string *)in_stack_fffffffffffff7f8);
      std::operator+(__lhs,__rhs);
      lexical_analyzer_t<cfgfile::string_trait_t>::line_number
                ((lexical_analyzer_t<cfgfile::string_trait_t> *)(in_RDI + 0x60));
      string_trait_t::to_string_abi_cxx11_((pos_t)in_stack_fffffffffffff7f8);
      std::operator+(__lhs,__rhs);
      str = local_6f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (this_01,(char *)__lhs,(allocator<char> *)__rhs);
      string_trait_t::from_ascii(str);
      std::operator+(__lhs,__rhs);
      exception_t<cfgfile::string_trait_t>::exception_t(this_00,what);
      __cxa_throw(__lhs,&exception_t<cfgfile::string_trait_t>::typeinfo,
                  exception_t<cfgfile::string_trait_t>::~exception_t);
    }
    local_1 = 1;
  }
  else {
    local_1 = 0;
  }
  lexeme_t<cfgfile::string_trait_t>::~lexeme_t((lexeme_t<cfgfile::string_trait_t> *)0x14831e);
  return (bool)(local_1 & 1);
}

Assistant:

bool start_first_tag_parsing()
	{
		lexeme_t< Trait > lexeme = m_lex.next_lexeme();

		if( this->m_tag.is_mandatory() && lexeme.type() == lexeme_type_t::null )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected end of file. "
					"Undefined mandatory tag \"" ) + this->m_tag.name() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );
		else if( !this->m_tag.is_mandatory() &&
			lexeme.type() == lexeme_type_t::null )
				return false;
		else if( lexeme.type() != lexeme_type_t::start )
			throw exception_t< Trait >(
				Trait::from_ascii( "Expected start curl brace, "
					"but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );

		lexeme = m_lex.next_lexeme();

		if( !start_tag_parsing( lexeme, this->m_tag ) )
			throw exception_t< Trait >(
				Trait::from_ascii( "Unexpected tag name. "
					"We expected \"" ) + this->m_tag.name() +
				Trait::from_ascii( "\", but we've got \"" ) + lexeme.value() +
				Trait::from_ascii( "\". In file \"" ) +
				m_lex.input_stream().file_name() +
				Trait::from_ascii( "\" on line " ) +
				Trait::to_string( m_lex.line_number() ) +
				Trait::from_ascii( "." ) );

		return true;
	}